

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::image::anon_unknown_0::StoreTest::createInstance(StoreTest *this,Context *context)

{
  int *this_00;
  undefined1 *this_01;
  uint uVar1;
  long lVar2;
  long lVar3;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data_00;
  StoreTestInstance *this_02;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDeviceSize VVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Image *this_03;
  Buffer *this_04;
  ulong uVar5;
  undefined4 *__s;
  ulong uVar6;
  Buffer *this_05;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_b8;
  undefined1 *local_a8;
  int *local_a0;
  StoreTestInstance *local_98;
  DeviceInterface *local_90;
  VkImageCreateInfo local_88;
  
  if ((this->m_texture).m_type == IMAGE_TYPE_BUFFER) {
    this_02 = (StoreTestInstance *)operator_new(200);
    StoreTestInstance::StoreTestInstance
              (this_02,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               false);
    (this_02->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__BufferStoreTestInstance_00bd91a8;
    this_02[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_02[1].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    this_02[1].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_02[1].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_02[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_02[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_02[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_02[1].super_BaseTestInstance.field_0x2e = 0;
    this_02[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_02[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_02[1].m_imageSizeBytes = 0;
    this_02[2].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_02[2].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    this_02[2].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_02[2].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_02[2].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_02[2].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_02[2].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_02[2].super_BaseTestInstance.field_0x2e = 0;
    this_02[2].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
  }
  else {
    this_02 = (StoreTestInstance *)operator_new(0xe0);
    StoreTestInstance::StoreTestInstance
              (this_02,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               this->m_singleLayerBind);
    (this_02->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ImageStoreTestInstance_00bd9310;
    this_02[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_05 = (Buffer *)&this_02[1].super_BaseTestInstance.m_texture;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    local_98 = this_02 + 1;
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar4 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
    this_02[1].super_BaseTestInstance.m_texture.m_numLayers = (int)VVar4;
    this_02[1].super_BaseTestInstance.m_texture.m_numSamples = (int)(VVar4 >> 0x20);
    this_00 = &this_02[2].super_BaseTestInstance.m_texture.m_numLayers;
    this_02[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_02[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_02[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_02[1].super_BaseTestInstance.field_0x2e = 0;
    this_02[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_02[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_02[1].m_imageSizeBytes = 0;
    this_02[2].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_02[2].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)this_00,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    this_01 = &this_02[2].m_imageBuffer.
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
               field_0x8;
    local_a0 = this_00;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)this_01,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_a8 = this_01;
    vk = Context::getDeviceInterface((this_02->super_BaseTestInstance).super_TestInstance.m_context)
    ;
    device = Context::getDevice((this_02->super_BaseTestInstance).super_TestInstance.m_context);
    allocator = Context::getDefaultAllocator
                          ((this_02->super_BaseTestInstance).super_TestInstance.m_context);
    this_03 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,&(this_02->super_BaseTestInstance).m_texture,
                        (this_02->super_BaseTestInstance).m_format,9,0);
    Image::Image(this_03,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
    local_b8.m_data.ptr = (Buffer *)0x0;
    data._8_8_ = device;
    data.ptr = (Image *)this_05;
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
               (this_02 + 1),data);
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_b8);
    uVar1 = (this_02->super_BaseTestInstance).m_texture.m_numLayers;
    VVar4 = *(long *)&this_02[1].super_BaseTestInstance.m_texture.m_numLayers * (long)(int)uVar1;
    this_04 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,VVar4,0x10);
    image::Buffer::Buffer
              (this_04,vk,device,allocator,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_b8.m_data.ptr = (Buffer *)0x0;
    data_00._8_8_ = device;
    data_00.ptr = this_05;
    local_90 = vk;
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
              ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)this_05,
               data_00);
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
    ~UniqueBase(&local_b8);
    lVar2 = **(long **)this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data;
    __s = *(undefined4 **)(lVar2 + 0x18);
    uVar6 = 0;
    memset(__s,0,VVar4);
    lVar3 = *(long *)&this_02[1].super_BaseTestInstance.m_texture.m_numLayers;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      *__s = (int)uVar6;
      __s = (undefined4 *)((long)__s + lVar3);
    }
    ::vk::flushMappedMemoryRange
              (local_90,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),
               *(VkDeviceSize *)(lVar2 + 0x10),VVar4);
  }
  return (TestInstance *)this_02;
}

Assistant:

TestInstance* StoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader);
	else
		return new ImageStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader, m_singleLayerBind);
}